

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O1

Gia_Man_t * Gia_ManSpeedup(Gia_Man_t *p,int Percentage,int Degree,int fVerbose,int fVeryVerbose)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Flt_t *pVVar5;
  float *pfVar6;
  uint uVar7;
  int iVar8;
  Tim_Man_t *pTVar9;
  void *pvVar10;
  Gia_Man_t *p_00;
  int *piVar11;
  Gia_Rpr_t *pGVar12;
  ulong uVar13;
  Vec_Int_t *vTimes;
  Vec_Int_t *vLeaves;
  Gia_Man_t *pGVar14;
  Vec_Int_t *pVVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  char *pcVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  size_t __nmemb;
  Tim_Man_t *p_01;
  long lVar28;
  float fVar29;
  double dVar30;
  float tDelta;
  uint local_74;
  int local_64;
  
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSpeedup.c"
                  ,0x27f,"Gia_Man_t *Gia_ManSpeedup(Gia_Man_t *, int, int, int, int)");
  }
  pvVar10 = p->pLutLib;
  if ((pvVar10 == (void *)0x0) && (p_01 = (Tim_Man_t *)p->pManTime, p_01 != (Tim_Man_t *)0x0)) {
    pTVar9 = Tim_ManDup(p_01,1);
    p->pManTime = pTVar9;
  }
  else {
    p_01 = (Tim_Man_t *)0x0;
  }
  fVar29 = Gia_ManDelayTraceLut(p);
  if (pvVar10 == (void *)0x0) {
    tDelta = 1.0;
  }
  else {
    tDelta = ((float)Percentage * fVar29) / 100.0;
  }
  if (fVerbose != 0) {
    printf("Max delay = %.2f. Delta = %.2f. ",(double)fVar29,(double)tDelta);
    pcVar21 = "LUT library";
    if (pvVar10 == (void *)0x0) {
      pcVar21 = "unit-delay";
    }
    printf("Using %s model. ",pcVar21);
    if (pvVar10 != (void *)0x0) {
      printf("Percentage = %d. ",Percentage);
    }
    putchar(10);
  }
  uVar7 = p->nObjs;
  pvVar10 = calloc((long)(int)uVar7,4);
  if (1 < (long)(int)uVar7) {
    lVar28 = 1;
    lVar26 = 5;
    do {
      if (p->vMapping->nSize <= lVar28) goto LAB_0022bc33;
      if (p->vMapping->pArray[lVar28] != 0) {
        if (p->vTiming->nSize <= (int)lVar26) goto LAB_0022bc71;
        if (p->vTiming->pArray[lVar26] < tDelta) {
          uVar7 = Gia_LutDelayTraceTCEdges(p,(int)lVar28,tDelta);
          *(uint *)((long)pvVar10 + lVar28 * 4) = uVar7;
        }
      }
      lVar28 = lVar28 + 1;
      uVar7 = p->nObjs;
      lVar26 = lVar26 + 3;
    } while (lVar28 < (int)uVar7);
  }
  if (fVerbose != 0) {
    uVar13 = 0;
    iVar25 = 0;
    if (1 < (int)uVar7) {
      uVar20 = p->vMapping->nSize;
      uVar22 = 1;
      if (1 < (int)uVar20) {
        uVar22 = (ulong)uVar20;
      }
      uVar23 = 1;
      iVar25 = 0;
      uVar13 = 0;
      do {
        if (uVar23 == uVar22) goto LAB_0022bc33;
        piVar11 = p->vMapping->pArray;
        uVar24 = piVar11[uVar23];
        if ((ulong)uVar24 != 0) {
          if ((int)uVar20 <= (int)uVar24 || (int)uVar24 < 0) goto LAB_0022bc33;
          puVar1 = (uint *)(piVar11 + uVar24);
          uVar2 = *puVar1;
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          uVar27 = 0;
          while (uVar2 != uVar27) {
            uVar16 = puVar1[uVar27 + 1];
            if (uVar7 <= uVar16) goto LAB_0022bc52;
            if (((undefined1  [12])p->pObjs[uVar16] & (undefined1  [12])0x9fffffff) !=
                (undefined1  [12])0x9fffffff) {
              uVar16 = uVar16 * 3 + 2;
              if (p->vTiming->nSize <= (int)uVar16) goto LAB_0022bc71;
              pfVar6 = p->vTiming->pArray + uVar16;
              if (*pfVar6 <= tDelta && tDelta != *pfVar6) {
                uVar13 = (ulong)((int)uVar13 + 1);
              }
            }
            uVar27 = uVar27 + 1;
            if ((int)uVar20 <= (int)uVar24 || (int)uVar24 < 0) goto LAB_0022bc33;
          }
          uVar24 = *(uint *)((long)pvVar10 + uVar23 * 4);
          uVar24 = (uVar24 >> 1 & 0x55555555) + (uVar24 & 0x55555555);
          uVar24 = (uVar24 >> 2 & 0x33333333) + (uVar24 & 0x33333333);
          uVar24 = (uVar24 >> 4 & 0x7070707) + (uVar24 & 0x7070707);
          uVar24 = (uVar24 >> 8 & 0xf000f) + (uVar24 & 0xf000f);
          iVar25 = (uVar24 >> 0x10) + iVar25 + (uVar24 & 0xffff);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != uVar7);
    }
    uVar7 = Gia_ManLutFaninCount(p);
    dVar30 = 0.0;
    if ((int)uVar13 != 0) {
      dVar30 = (double)iVar25 / (double)(int)uVar13;
    }
    printf("Edges: Total = %7d. 0-slack = %7d. Critical = %7d. Ratio = %4.2f\n",dVar30,(ulong)uVar7,
           uVar13);
  }
  p_00 = Gia_ManDup(p);
  Gia_ManHashStart(p_00);
  iVar25 = p_00->nObjs;
  __nmemb = (long)iVar25 * 3 + 1000;
  piVar11 = (int *)calloc(__nmemb,4);
  p_00->pNexts = piVar11;
  pGVar12 = (Gia_Rpr_t *)calloc(__nmemb,4);
  p_00->pReprs = pGVar12;
  if (-0x14e < (long)iVar25) {
    uVar13 = 1;
    if (1 < (int)__nmemb) {
      uVar13 = __nmemb & 0xffffffff;
    }
    uVar22 = 0;
    do {
      p_00->pReprs[uVar22] = (Gia_Rpr_t)((uint)p_00->pReprs[uVar22] | 0xfffffff);
      uVar22 = uVar22 + 1;
    } while (uVar13 != uVar22);
  }
  vTimes = (Vec_Int_t *)malloc(0x10);
  vTimes->nCap = 0x10;
  vTimes->nSize = 0;
  piVar11 = (int *)malloc(0x40);
  vTimes->pArray = piVar11;
  vLeaves = (Vec_Int_t *)malloc(0x10);
  vLeaves->nCap = 0x10;
  vLeaves->nSize = 0;
  piVar11 = (int *)malloc(0x40);
  vLeaves->pArray = piVar11;
  uVar13 = (ulong)(uint)p->nObjs;
  local_74 = 0;
  local_64 = 0;
  if (1 < p->nObjs) {
    uVar22 = 1;
    local_64 = 0;
    local_74 = 0;
    do {
      iVar3 = p->vMapping->nSize;
      if ((long)iVar3 <= (long)uVar22) {
LAB_0022bc33:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar11 = p->vMapping->pArray;
      uVar7 = piVar11[uVar22];
      if ((ulong)uVar7 != 0) {
        if (p->vTiming->nSize <= (int)uVar22 * 3 + 2) goto LAB_0022bc71;
        if (p->vTiming->pArray[uVar22 * 3 + 2] < tDelta) {
          if (iVar3 <= (int)uVar7 || (int)uVar7 < 0) goto LAB_0022bc33;
          puVar1 = (uint *)(piVar11 + uVar7);
          uVar20 = *puVar1;
          uVar27 = 0;
          uVar23 = (ulong)uVar20;
          if ((int)uVar20 < 1) {
            uVar23 = uVar27;
          }
          uVar20 = 0;
          while (uVar23 != uVar27) {
            uVar24 = puVar1[uVar27 + 1];
            if (((long)(int)uVar24 < 0) || ((int)uVar13 <= (int)uVar24)) goto LAB_0022bc52;
            if (((undefined1  [12])p->pObjs[(int)uVar24] & (undefined1  [12])0x9fffffff) !=
                (undefined1  [12])0x9fffffff) {
              uVar20 = uVar20 + ((*(uint *)((long)pvVar10 + uVar22 * 4) >> ((uint)uVar27 & 0x1f) & 1
                                 ) != 0);
            }
            uVar27 = uVar27 + 1;
            if (iVar3 <= (int)uVar7 || (int)uVar7 < 0) goto LAB_0022bc33;
          }
          if (fVeryVerbose != 0 || uVar20 != 0) {
            vTimes->nSize = 0;
            if (uVar20 != 0) {
              pVVar15 = p->vMapping;
              lVar26 = (long)pVVar15->nSize;
              if (lVar26 <= (long)uVar22) goto LAB_0022bc33;
              lVar28 = 0;
              while( true ) {
                piVar11 = pVVar15->pArray;
                lVar17 = (long)piVar11[uVar22];
                if ((lVar17 < 0) || ((int)lVar26 <= piVar11[uVar22])) goto LAB_0022bc33;
                if (piVar11[lVar17] <= lVar28) break;
                iVar3 = piVar11[lVar17 + lVar28 + 1];
                lVar26 = (long)iVar3;
                if ((lVar26 < 0) || (p->nObjs <= iVar3)) goto LAB_0022bc52;
                if ((((undefined1  [12])p->pObjs[lVar26] & (undefined1  [12])0x9fffffff) !=
                     (undefined1  [12])0x9fffffff) &&
                   ((*(uint *)((long)pvVar10 + uVar22 * 4) >> ((uint)lVar28 & 0x1f) & 1) != 0)) {
                  pVVar15 = p->vMapping;
                  iVar8 = pVVar15->nSize;
                  if (iVar8 <= iVar3) goto LAB_0022bc33;
                  lVar17 = 0;
                  while( true ) {
                    piVar11 = pVVar15->pArray;
                    lVar18 = (long)piVar11[lVar26];
                    if ((lVar18 < 0) || (iVar8 <= piVar11[lVar26])) goto LAB_0022bc33;
                    if (piVar11[lVar18] <= lVar17) break;
                    if ((*(uint *)((long)pvVar10 + lVar26 * 4) >> ((uint)lVar17 & 0x1f) & 1) != 0) {
                      if (0 < (long)vTimes->nSize) {
                        lVar19 = 0;
                        do {
                          if (vTimes->pArray[lVar19] == piVar11[lVar18 + lVar17 + 1])
                          goto LAB_0022b6b4;
                          lVar19 = lVar19 + 1;
                        } while (vTimes->nSize != lVar19);
                      }
                      Vec_IntPush(vTimes,piVar11[lVar18 + lVar17 + 1]);
                    }
LAB_0022b6b4:
                    lVar17 = lVar17 + 1;
                    pVVar15 = p->vMapping;
                    iVar8 = pVVar15->nSize;
                    if (iVar8 <= iVar3) goto LAB_0022bc33;
                  }
                }
                lVar28 = lVar28 + 1;
                pVVar15 = p->vMapping;
                lVar26 = (long)pVVar15->nSize;
                if (lVar26 <= (long)uVar22) goto LAB_0022bc33;
              }
            }
            local_74 = local_74 + 1;
            uVar7 = vTimes->nSize;
            if ((int)uVar7 <= Degree && uVar7 != 0) {
              vLeaves->nSize = 0;
              pVVar15 = p->vMapping;
              lVar26 = (long)pVVar15->nSize;
              if (lVar26 <= (long)uVar22) goto LAB_0022bc33;
              local_64 = local_64 + 1;
              lVar28 = 0;
              while( true ) {
                piVar11 = pVVar15->pArray;
                lVar17 = (long)piVar11[uVar22];
                if ((lVar17 < 0) || ((int)lVar26 <= piVar11[uVar22])) goto LAB_0022bc33;
                if (piVar11[lVar17] <= lVar28) break;
                iVar3 = piVar11[lVar17 + lVar28 + 1];
                lVar26 = (long)iVar3;
                if ((lVar26 < 0) || (p->nObjs <= iVar3)) goto LAB_0022bc52;
                if (((undefined1  [12])p->pObjs[lVar26] & (undefined1  [12])0x9fffffff) ==
                    (undefined1  [12])0x9fffffff) {
                  if (0 < (long)vLeaves->nSize) {
                    lVar26 = 0;
                    do {
                      if (vLeaves->pArray[lVar26] == iVar3) goto LAB_0022b7c8;
                      lVar26 = lVar26 + 1;
                    } while (vLeaves->nSize != lVar26);
                  }
                  Vec_IntPush(vLeaves,iVar3);
                }
                else {
                  pVVar15 = p->vMapping;
                  iVar8 = pVVar15->nSize;
                  if (iVar8 <= iVar3) goto LAB_0022bc33;
                  lVar17 = 0;
                  while( true ) {
                    piVar11 = pVVar15->pArray;
                    lVar18 = (long)piVar11[lVar26];
                    if ((lVar18 < 0) || (iVar8 <= piVar11[lVar26])) goto LAB_0022bc33;
                    if (piVar11[lVar18] <= lVar17) break;
                    if (0 < (long)vLeaves->nSize) {
                      lVar19 = 0;
                      do {
                        if (vLeaves->pArray[lVar19] == piVar11[lVar18 + lVar17 + 1])
                        goto LAB_0022b854;
                        lVar19 = lVar19 + 1;
                      } while (vLeaves->nSize != lVar19);
                    }
                    Vec_IntPush(vLeaves,piVar11[lVar18 + lVar17 + 1]);
LAB_0022b854:
                    lVar17 = lVar17 + 1;
                    pVVar15 = p->vMapping;
                    iVar8 = pVVar15->nSize;
                    if (iVar8 <= iVar3) goto LAB_0022bc33;
                  }
                }
LAB_0022b7c8:
                lVar28 = lVar28 + 1;
                pVVar15 = p->vMapping;
                lVar26 = (long)pVVar15->nSize;
                if (lVar26 <= (long)uVar22) goto LAB_0022bc33;
              }
              if (fVeryVerbose != 0) {
                printf("%5d Node %5d : %d %2d %2d  ",(ulong)local_74,uVar22 & 0xffffffff,
                       (ulong)uVar20,(ulong)uVar7,(ulong)(uint)vLeaves->nSize);
                pVVar15 = p->vMapping;
                lVar26 = (long)pVVar15->nSize;
                if (lVar26 <= (long)uVar22) goto LAB_0022bc33;
                lVar28 = 0;
                while( true ) {
                  piVar11 = pVVar15->pArray;
                  lVar17 = (long)piVar11[uVar22];
                  if ((lVar17 < 0) || ((int)lVar26 <= piVar11[uVar22])) goto LAB_0022bc33;
                  if (piVar11[lVar17] <= lVar28) break;
                  uVar20 = piVar11[lVar17 + lVar28 + 1];
                  if ((int)uVar20 < 0) goto LAB_0022bc71;
                  uVar24 = uVar20 * 3 + 2;
                  if (p->vTiming->nSize <= (int)uVar24) goto LAB_0022bc71;
                  pcVar21 = "*";
                  if ((*(uint *)((long)pvVar10 + uVar22 * 4) >> ((uint)lVar28 & 0x1f) & 1) == 0) {
                    pcVar21 = "";
                  }
                  printf("%d(%.2f)%s ",(double)p->vTiming->pArray[uVar24],(ulong)uVar20,pcVar21);
                  lVar28 = lVar28 + 1;
                  pVVar15 = p->vMapping;
                  lVar26 = (long)pVVar15->nSize;
                  if (lVar26 <= (long)uVar22) goto LAB_0022bc33;
                }
                putchar(10);
              }
              if (1 < (int)uVar7) {
                piVar11 = vTimes->pArray;
                iVar3 = *piVar11;
                if (iVar3 < 0) goto LAB_0022bc71;
                uVar20 = iVar3 * 3 + 2;
                iVar8 = p->vTiming->nSize;
                if (((iVar8 <= (int)uVar20) || (iVar4 = piVar11[1], iVar4 < 0)) ||
                   (uVar24 = iVar4 * 3 + 2, iVar8 <= (int)uVar24)) goto LAB_0022bc71;
                pfVar6 = p->vTiming->pArray;
                fVar29 = pfVar6[uVar24];
                pfVar6 = pfVar6 + uVar20;
                if (*pfVar6 <= fVar29 && fVar29 != *pfVar6) {
                  *piVar11 = iVar4;
                  piVar11[1] = iVar3;
                }
              }
              if (2 < (int)uVar7) {
                piVar11 = vTimes->pArray;
                iVar3 = piVar11[1];
                if (iVar3 < 0) {
LAB_0022bc71:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                                ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
                }
                pVVar5 = p->vTiming;
                uVar20 = iVar3 * 3 + 2;
                if (((pVVar5->nSize <= (int)uVar20) || (iVar8 = piVar11[2], iVar8 < 0)) ||
                   (uVar24 = iVar8 * 3 + 2, pVVar5->nSize <= (int)uVar24)) goto LAB_0022bc71;
                pfVar6 = pVVar5->pArray;
                if (pfVar6[uVar20] <= pfVar6[uVar24] && pfVar6[uVar24] != pfVar6[uVar20]) {
                  if ((int)uVar7 < 2) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                  }
                  piVar11[1] = iVar8;
                  piVar11[2] = iVar3;
                }
                if ((int)uVar7 < 2) goto LAB_0022bc33;
                iVar3 = *piVar11;
                if (iVar3 < 0) goto LAB_0022bc71;
                uVar7 = iVar3 * 3 + 2;
                if (((pVVar5->nSize <= (int)uVar7) || (iVar8 = piVar11[1], iVar8 < 0)) ||
                   (uVar20 = iVar8 * 3 + 2, pVVar5->nSize <= (int)uVar20)) goto LAB_0022bc71;
                if (pfVar6[uVar7] <= pfVar6[uVar20] && pfVar6[uVar20] != pfVar6[uVar7]) {
                  *piVar11 = iVar8;
                  piVar11[1] = iVar3;
                }
              }
              if ((long)p->nObjs <= (long)uVar22) {
LAB_0022bc52:
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              Gia_ManSpeedupObj(p_00,p,p->pObjs + uVar22,vLeaves,vTimes);
              if (iVar25 * 3 + 900 < p_00->nObjs) {
                puts("Speedup stopped adding choices because there was too many to add.");
                break;
              }
            }
          }
        }
      }
      uVar22 = uVar22 + 1;
      uVar13 = (ulong)p->nObjs;
    } while ((long)uVar22 < (long)uVar13);
  }
  if (p->vTiming == (Vec_Flt_t *)0x0) {
    __assert_fail("p->vTiming != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x26c,"void Gia_ManTimeStop(Gia_Man_t *)");
  }
  pfVar6 = p->vTiming->pArray;
  if (pfVar6 != (float *)0x0) {
    free(pfVar6);
    p->vTiming->pArray = (float *)0x0;
  }
  if (p->vTiming != (Vec_Flt_t *)0x0) {
    free(p->vTiming);
    p->vTiming = (Vec_Flt_t *)0x0;
  }
  if (vTimes->pArray != (int *)0x0) {
    free(vTimes->pArray);
    vTimes->pArray = (int *)0x0;
  }
  free(vTimes);
  if (vLeaves->pArray != (int *)0x0) {
    free(vLeaves->pArray);
    vLeaves->pArray = (int *)0x0;
  }
  free(vLeaves);
  if (pvVar10 != (void *)0x0) {
    free(pvVar10);
  }
  if (fVerbose != 0) {
    uVar7 = Gia_ManLutNum(p);
    dVar30 = 0.0;
    if (local_74 != 0) {
      dVar30 = (double)local_64 / (double)(int)local_74;
    }
    printf("Nodes: Total = %7d. 0-slack = %7d. Workable = %7d. Ratio = %4.2f\n",dVar30,(ulong)uVar7)
    ;
  }
  if (p_01 != (Tim_Man_t *)0x0) {
    Tim_ManStop((Tim_Man_t *)p->pManTime);
    p->pManTime = p_01;
  }
  pGVar14 = Gia_ManEquivToChoices(p_00,1);
  Gia_ManStop(p_00);
  return pGVar14;
}

Assistant:

Gia_Man_t * Gia_ManSpeedup( Gia_Man_t * p, int Percentage, int Degree, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vTimeCries, * vTimeFanins;
    int iObj, iFanin, iFanin2, nNodesNew;
    float tDelta, tArrival;
    int i, k, k2, Counter, CounterRes, nTimeCris;
    int fUseLutLib = (p->pLutLib != NULL);
    void * pTempTim = NULL;
    unsigned * puTCEdges;
    assert( Gia_ManHasMapping(p) );
    if ( !fUseLutLib && p->pManTime )
    {
        pTempTim = p->pManTime;
        p->pManTime = Tim_ManDup( (Tim_Man_t *)pTempTim, 1 );
    }
    // perform delay trace
    tArrival = Gia_ManDelayTraceLut( p );
    tDelta = fUseLutLib ? tArrival*Percentage/100.0 : 1.0;
    if ( fVerbose )
    {
        printf( "Max delay = %.2f. Delta = %.2f. ", tArrival, tDelta );
        printf( "Using %s model. ", fUseLutLib ? "LUT library" : "unit-delay" );
        if ( fUseLutLib )
            printf( "Percentage = %d. ", Percentage );
        printf( "\n" );
    }
    // mark the timing critical nodes and edges
    puTCEdges = ABC_CALLOC( unsigned, Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, iObj )
    {
        if ( Gia_ObjTimeSlack(p, iObj) >= tDelta )
            continue;
        puTCEdges[iObj] = Gia_LutDelayTraceTCEdges( p, iObj, tDelta );
    }
    if ( fVerbose )
    {
        Counter = CounterRes = 0;
        Gia_ManForEachLut( p, iObj )
        {
            Gia_LutForEachFanin( p, iObj, iFanin, k )
                if ( !Gia_ObjIsCi(Gia_ManObj(p, iFanin)) && Gia_ObjTimeSlack(p, iFanin) < tDelta )
                    Counter++;
            CounterRes += Gia_WordCountOnes( puTCEdges[iObj] );
        }
        printf( "Edges: Total = %7d. 0-slack = %7d. Critical = %7d. Ratio = %4.2f\n", 
            Gia_ManLutFaninCount(p), Counter, CounterRes, Counter? 1.0*CounterRes/Counter : 0.0 );
    }

    // start the resulting network
    pNew = Gia_ManDup( p );
    Gia_ManHashStart( pNew );
    nNodesNew = 1000 + 3 * Gia_ManObjNum(pNew);
    pNew->pNexts = ABC_CALLOC( int, nNodesNew );
    pNew->pReprs = ABC_CALLOC( Gia_Rpr_t, nNodesNew );
    for ( i = 0; i < nNodesNew; i++ )
        Gia_ObjSetRepr( pNew, i, GIA_VOID );

    // collect nodes to be used for resynthesis
    Counter = CounterRes = 0;
    vTimeCries = Vec_IntAlloc( 16 );
    vTimeFanins = Vec_IntAlloc( 16 );
    Gia_ManForEachLut( p, iObj )
    {
        if ( Gia_ObjTimeSlack(p, iObj) >= tDelta )
            continue;
        // count the number of non-PI timing-critical nodes
        nTimeCris = 0;
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( !Gia_ObjIsCi(Gia_ManObj(p, iFanin)) && (puTCEdges[iObj] & (1<<k)) )
                nTimeCris++;
        if ( !fVeryVerbose && nTimeCris == 0 )
            continue;
        Counter++;
        // count the total number of timing critical second-generation nodes
        Vec_IntClear( vTimeCries );
        if ( nTimeCris )
        {
            Gia_LutForEachFanin( p, iObj, iFanin, k )
                if ( !Gia_ObjIsCi(Gia_ManObj(p, iFanin)) && (puTCEdges[iObj] & (1<<k)) )
                    Gia_LutForEachFanin( p, iFanin, iFanin2, k2 )
                        if ( puTCEdges[iFanin] & (1<<k2) )
                            Vec_IntPushUnique( vTimeCries, iFanin2 );
        }
//        if ( !fVeryVerbose && (Vec_IntSize(vTimeCries) == 0 || Vec_IntSize(vTimeCries) > Degree) )
        if ( (Vec_IntSize(vTimeCries) == 0 || Vec_IntSize(vTimeCries) > Degree) )
            continue;
        CounterRes++;
        // collect second generation nodes
        Vec_IntClear( vTimeFanins );
        Gia_LutForEachFanin( p, iObj, iFanin, k )
        {
            if ( Gia_ObjIsCi(Gia_ManObj(p, iFanin)) )
                Vec_IntPushUnique( vTimeFanins, iFanin );
            else
                Gia_LutForEachFanin( p, iFanin, iFanin2, k2 )
                    Vec_IntPushUnique( vTimeFanins, iFanin2 );                    
        }
        // print the results
        if ( fVeryVerbose )
        {
        printf( "%5d Node %5d : %d %2d %2d  ", Counter, iObj, 
            nTimeCris, Vec_IntSize(vTimeCries), Vec_IntSize(vTimeFanins) );
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            printf( "%d(%.2f)%s ", iFanin, Gia_ObjTimeSlack(p, iFanin), (puTCEdges[iObj] & (1<<k))? "*":"" );
        printf( "\n" );
        }
        // add the node to choices
        if ( Vec_IntSize(vTimeCries) == 0 || Vec_IntSize(vTimeCries) > Degree )
            continue;
        // order the fanins in the increasing order of criticalily
        if ( Vec_IntSize(vTimeCries) > 1 )
        {
            iFanin = Vec_IntEntry( vTimeCries, 0 );
            iFanin2 = Vec_IntEntry( vTimeCries, 1 );
            if ( Gia_ObjTimeSlack(p, iFanin) < Gia_ObjTimeSlack(p, iFanin2) )
            {
                Vec_IntWriteEntry( vTimeCries, 0, iFanin2 );
                Vec_IntWriteEntry( vTimeCries, 1, iFanin );
            }
        }
        if ( Vec_IntSize(vTimeCries) > 2 )
        {
            iFanin = Vec_IntEntry( vTimeCries, 1 );
            iFanin2 = Vec_IntEntry( vTimeCries, 2 );
            if ( Gia_ObjTimeSlack(p, iFanin) < Gia_ObjTimeSlack(p, iFanin2) )
            {
                Vec_IntWriteEntry( vTimeCries, 1, iFanin2 );
                Vec_IntWriteEntry( vTimeCries, 2, iFanin );
            }
            iFanin = Vec_IntEntry( vTimeCries, 0 );
            iFanin2 = Vec_IntEntry( vTimeCries, 1 );
            if ( Gia_ObjTimeSlack(p, iFanin) < Gia_ObjTimeSlack(p, iFanin2) )
            {
                Vec_IntWriteEntry( vTimeCries, 0, iFanin2 );
                Vec_IntWriteEntry( vTimeCries, 1, iFanin );
            }
        }
        // add choice
        Gia_ManSpeedupObj( pNew, p, Gia_ManObj(p,iObj), vTimeFanins, vTimeCries );
        // quit if the number of nodes is large
        if ( Gia_ManObjNum(pNew) > nNodesNew - 100 )
        {
            printf( "Speedup stopped adding choices because there was too many to add.\n" );
            break;
        }
    }
    Gia_ManTimeStop( p );
    Vec_IntFree( vTimeCries );
    Vec_IntFree( vTimeFanins );
    ABC_FREE( puTCEdges );
    if ( fVerbose )
        printf( "Nodes: Total = %7d. 0-slack = %7d. Workable = %7d. Ratio = %4.2f\n", 
        Gia_ManLutNum(p), Counter, CounterRes, Counter? 1.0*CounterRes/Counter : 0.0 ); 
    if ( pTempTim )
    {
        Tim_ManStop( (Tim_Man_t *)p->pManTime );
        p->pManTime = pTempTim;
    }
    // derive AIG with choices
//Gia_ManPrintStats( pNew, 0 );
    pTemp = Gia_ManEquivToChoices( pNew, 1 );
    Gia_ManStop( pNew );
//Gia_ManPrintStats( pTemp, 0 );
//    pNew = Gia_ManDupOrderDfsChoices( pTemp );
//    Gia_ManStop( pTemp );
//Gia_ManPrintStats( pNew, 0 );
//    return pNew;
    return pTemp;
}